

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWrite16bAsPGM(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long in_RSI;
  FILE *in_RDI;
  uint32_t y;
  uint32_t bytes_per_px;
  int stride;
  uint8_t *rgba;
  uint32_t height;
  uint32_t width;
  uint local_34;
  void *local_28;
  int local_4;
  
  if ((in_RDI == (FILE *)0x0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    uVar1 = *(uint *)(in_RSI + 4);
    uVar2 = *(uint *)(in_RSI + 8);
    local_28 = *(void **)(in_RSI + 0x10);
    iVar3 = *(int *)(in_RSI + 0x18);
    if (local_28 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      fprintf(in_RDI,"P5\n%u %u\n255\n",(ulong)(uVar1 << 1),(ulong)uVar2);
      for (local_34 = 0; local_34 < uVar2; local_34 = local_34 + 1) {
        sVar4 = fwrite(local_28,(ulong)uVar1,2,in_RDI);
        if (sVar4 != 2) {
          return 0;
        }
        local_28 = (void *)((long)local_28 + (long)iVar3);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int WebPWrite16bAsPGM(FILE* fout, const WebPDecBuffer* const buffer) {
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  const uint32_t bytes_per_px = 2;
  uint32_t y;

  if (fout == NULL || buffer == NULL) return 0;

  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;

  if (rgba == NULL) return 0;

  fprintf(fout, "P5\n%u %u\n255\n", width * bytes_per_px, height);
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, width, bytes_per_px, fout) != bytes_per_px) {
      return 0;
    }
    rgba += stride;
  }
  return 1;
}